

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

SystemTimingCheckSyntax * __thiscall slang::parsing::Parser::parseSystemTimingCheck(Parser *this)

{
  Token closeParen_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  TimingCheckArgSyntax *pTVar4;
  undefined4 extraout_var;
  SystemTimingCheckSyntax *pSVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *extraout_RDX;
  undefined8 extraout_RDX_00;
  TokenKind TVar9;
  ulong uVar10;
  BumpAllocator *dst;
  TokenKind TVar11;
  Token name;
  Token TVar12;
  Token TVar13;
  Token closeParen;
  Token openParen;
  Token current;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  ulong local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  Token local_1d8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_1c8 [7];
  undefined8 uVar5;
  
  name = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&openParen);
  Token::Token(&closeParen);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((openParen._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&openParen);
    closeParen = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    local_1f0 = 0;
    uVar5 = 0;
    goto LAB_002bb002;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  current = TVar12;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar12.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_002bae40:
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    pIVar7 = closeParen.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleTimingCheckArg(TVar12.kind);
    if (bVar1) {
      do {
        do {
          pIVar7 = TVar12.info;
          pTVar4 = parseTimingCheckArg(this);
          local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar4;
          local_200 = CONCAT71(local_200._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar11 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11);
          if (TVar11 == EndOfFile || bVar1) goto LAB_002bae40;
          if (TVar11 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) goto LAB_002bae40;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_210._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_200 = local_200 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          pIVar8 = TVar13.info;
          TVar11 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11);
          if (TVar11 == EndOfFile || bVar1) {
            pTVar4 = parseTimingCheckArg(this);
            local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar4;
            local_200 = CONCAT71(local_200._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                       (TokenOrSyntax *)&local_210._M_first);
            goto LAB_002bae40;
          }
          TVar9 = TVar12.kind;
          uVar10 = TVar13._0_8_ & 0xffffffff;
          TVar12.info = pIVar8;
          TVar12.kind = (short)uVar10;
          TVar12._2_1_ = (char)(uVar10 >> 0x10);
          TVar12.numFlags.raw = (char)(uVar10 >> 0x18);
          TVar12.rawLen = (int)(uVar10 >> 0x20);
        } while (pIVar7 != pIVar8 || TVar9 != TVar11);
        bVar1 = ParserBase::
                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                          (&this->super_ParserBase,(DiagCode)0x10001,true);
        uVar10 = TVar13._0_8_ & 0xffffffff;
        TVar12.kind = (short)uVar10;
        TVar12._2_1_ = (char)(uVar10 >> 0x10);
        TVar12.numFlags.raw = (char)(uVar10 >> 0x18);
        TVar12.rawLen = (int)(uVar10 >> 0x20);
      } while (bVar1);
      goto LAB_002bae40;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar12,CloseParenthesis,&closeParen,(DiagCode)0x10001);
    pIVar7 = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)pIVar7);
  uVar5 = CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1f0 = extraout_RDX_00;
LAB_002bb002:
  TVar13 = openParen;
  TVar12 = closeParen;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_1c8[0].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.childCount = 0;
  local_1c8[0].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3268;
  local_210._8_4_ = 3;
  local_200 = 0;
  uStack_1f8 = 0;
  local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a4a30;
  local_1d8.kind = closeParen.kind;
  local_1d8._2_1_ = closeParen._2_1_;
  local_1d8.numFlags.raw = closeParen.numFlags.raw;
  local_1d8.rawLen = closeParen.rawLen;
  local_1d8.info = closeParen.info;
  closeParen = TVar12;
  local_1e8 = uVar5;
  local_1e0 = local_1f0;
  TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  closeParen_00.info = local_1d8.info;
  closeParen_00.kind = local_1d8.kind;
  closeParen_00._2_1_ = local_1d8._2_1_;
  closeParen_00.numFlags.raw = local_1d8.numFlags.raw;
  closeParen_00.rawLen = local_1d8.rawLen;
  pSVar6 = slang::syntax::SyntaxFactory::systemTimingCheck
                     (&this->factory,local_1c8,name,TVar13,
                      (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                      &local_210._M_first,closeParen_00,TVar12);
  return pSVar6;
}

Assistant:

SystemTimingCheckSyntax& Parser::parseSystemTimingCheck() {
    auto name = consume();

    Token openParen, closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleTimingCheckArg, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTimingCheckArg(); }, AllowEmpty::True);

    return factory.systemTimingCheck(nullptr, name, openParen, list, closeParen,
                                     expect(TokenKind::Semicolon));
}